

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

qint64 __thiscall QFSFileEnginePrivate::nativeRead(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QString *errorString;
  size_t sVar5;
  int *piVar6;
  long in_RDX;
  undefined1 *in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int readByte;
  size_t read;
  int i;
  int oldFlags;
  size_t readBytes;
  QFSFileEngine *q;
  FileError in_stack_ffffffffffffff8c;
  int local_58;
  long local_50;
  qint64 local_28;
  qint64 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  QFSFileEnginePrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = (QString *)q_func(in_RDI);
  if ((in_RDI->fh == (FILE *)0x0) ||
     (bVar2 = nativeIsSequential((QFSFileEnginePrivate *)0x18c8df), !bVar2)) {
    local_28 = readFdFh(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                        in_stack_ffffffffffffffe0);
  }
  else {
    local_50 = 0;
    iVar3 = fileno((FILE *)in_RDI->fh);
    uVar4 = fcntl(iVar3,3);
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      if ((uVar4 & 0x800) == 0) {
        iVar3 = fileno((FILE *)in_RDI->fh);
        fcntl(iVar3,4,(ulong)(uVar4 | 0x800));
      }
      do {
        sVar5 = fread(in_RSI + local_50,1,in_RDX - local_50,(FILE *)in_RDI->fh);
        in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
        if (sVar5 == 0) {
          iVar3 = feof((FILE *)in_RDI->fh);
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
          if (iVar3 == 0) {
            piVar6 = __errno_location();
            in_stack_ffffffffffffff8c = CONCAT13(*piVar6 == 4,(int3)in_stack_ffffffffffffff8c);
          }
        }
      } while ((char)(in_stack_ffffffffffffff8c >> 0x18) != '\0');
      if (sVar5 != 0) {
        local_50 = sVar5 + local_50;
        break;
      }
      if (local_50 != 0) break;
      local_50 = 0;
      if ((uVar4 & 0x800) == 0) {
        iVar3 = fileno((FILE *)in_RDI->fh);
        fcntl(iVar3,4,(ulong)uVar4);
        do {
          iVar3 = fgetc((FILE *)in_RDI->fh);
          in_stack_ffffffffffffff8c =
               CONCAT13((char)(in_stack_ffffffffffffff8c >> 0x18),
                        (uint3)(ushort)in_stack_ffffffffffffff8c);
          if (iVar3 == -1) {
            piVar6 = __errno_location();
            in_stack_ffffffffffffff8c =
                 CONCAT13((char)(in_stack_ffffffffffffff8c >> 0x18),
                          CONCAT12(*piVar6 == 4,(short)in_stack_ffffffffffffff8c));
          }
        } while ((char)(in_stack_ffffffffffffff8c >> 0x10) != '\0');
        if (iVar3 == -1) break;
        *in_RSI = (char)iVar3;
        local_50 = 1;
      }
    }
    if ((uVar4 & 0x800) == 0) {
      iVar3 = fileno((FILE *)in_RDI->fh);
      fcntl(iVar3,4,(ulong)uVar4);
    }
    if ((local_50 == 0) && (iVar3 = feof((FILE *)in_RDI->fh), iVar3 == 0)) {
      __errno_location();
      qt_error_string(in_stack_ffffffffffffff8c);
      QAbstractFileEngine::setError
                ((QAbstractFileEngine *)in_RDI,in_stack_ffffffffffffff8c,errorString);
      QString::~QString((QString *)0x18cb4e);
      local_28 = -1;
    }
    else {
      local_28 = local_50;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFSFileEnginePrivate::nativeRead(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (fh && nativeIsSequential()) {
        size_t readBytes = 0;
        int oldFlags = fcntl(QT_FILENO(fh), F_GETFL);
        for (int i = 0; i < 2; ++i) {
            // Unix: Make the underlying file descriptor non-blocking
            if ((oldFlags & O_NONBLOCK) == 0)
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags | O_NONBLOCK);

            // Cross platform stdlib read
            size_t read = 0;
            do {
                read = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            } while (read == 0 && !feof(fh) && errno == EINTR);
            if (read > 0) {
                readBytes += read;
                break;
            } else {
                if (readBytes)
                    break;
                readBytes = read;
            }

            // Unix: Restore the blocking state of the underlying socket
            if ((oldFlags & O_NONBLOCK) == 0) {
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
                if (readBytes == 0) {
                    int readByte = 0;
                    do {
                        readByte = fgetc(fh);
                    } while (readByte == -1 && errno == EINTR);
                    if (readByte != -1) {
                        *data = uchar(readByte);
                        readBytes += 1;
                    } else {
                        break;
                    }
                }
            }
        }
        // Unix: Restore the blocking state of the underlying socket
        if ((oldFlags & O_NONBLOCK) == 0) {
            fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
        }
        if (readBytes == 0 && !feof(fh)) {
            // if we didn't read anything and we're not at EOF, it must be an error
            q->setError(QFile::ReadError, qt_error_string(errno));
            return -1;
        }
        return readBytes;
    }

    return readFdFh(data, len);
}